

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void ego_display(menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  void *pvVar1;
  _Bool _Var2;
  uint8_t attr_00;
  uint8_t attr_01;
  char *pcVar3;
  size_t sVar4;
  uint8_t sq_attr;
  uint8_t attr;
  _Bool ignored;
  ego_desc *choice;
  char buf [80];
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *menu_local;
  
  buf._76_4_ = width;
  memset(&choice,0,0x50);
  pvVar1 = menu->menu_data;
  _Var2 = ego_is_ignored((int)*(short *)((long)pvVar1 + (long)oid * 0x10),
                         (uint)*(ushort *)((long)pvVar1 + (long)oid * 0x10 + 2));
  attr_00 = '\x01';
  if (cursor) {
    attr_00 = '\x0e';
  }
  attr_01 = '\r';
  if (_Var2) {
    attr_01 = '\f';
  }
  ego_item_name((char *)&choice,0x50,(ego_desc *)((long)pvVar1 + (long)oid * 0x10));
  pcVar3 = format("%s",&choice);
  c_put_str(attr_00,pcVar3,row,col);
  if (_Var2) {
    c_put_str('\f',"*",row,col + L'\x01');
  }
  pcVar3 = *(char **)((long)pvVar1 + (long)oid * 0x10 + 8);
  sVar4 = strlen((char *)&choice);
  c_put_str(attr_01,pcVar3,row,col + (int)sVar4);
  return;
}

Assistant:

static void ego_display(struct menu * menu, int oid, bool cursor, int row,
						int col, int width)
{
	char buf[80] = "";
	struct ego_desc *choice = (struct ego_desc *) menu->menu_data;
	bool ignored = ego_is_ignored(choice[oid].e_idx, choice[oid].itype);

	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
	uint8_t sq_attr = (ignored ? COLOUR_L_RED : COLOUR_L_GREEN);

	/* Acquire the "name" of object "i" */
	(void) ego_item_name(buf, sizeof(buf), &choice[oid]);

	/* Print it */
	c_put_str(attr, format("%s", buf), row, col);

	/* Show ignore mark, if any */
	if (ignored)
		c_put_str(COLOUR_L_RED, "*", row, col + 1);

	/* Show the stripped ego-item name using another colour */
	c_put_str(sq_attr, choice[oid].short_name, row, col + strlen(buf));
}